

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::ZoneStackBase::_cleanupBlock(ZoneStackBase *this,uint32_t side,size_t middleIndex)

{
  size_t size;
  long lVar1;
  void *in_RDX;
  uint in_ESI;
  long in_RDI;
  Block *prev;
  Block *block;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  undefined4 in_stack_ffffffffffffffe8;
  
  size = *(size_t *)(in_RDI + 8 + (ulong)in_ESI * 8);
  if (*(long *)(size + 0x10) != *(long *)(size + 0x18)) {
    DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
  }
  lVar1 = *(long *)(size + (ulong)((in_ESI != 0 ^ 0xffU) & 1) * 8);
  if (lVar1 == 0) {
    if (*(size_t *)(in_RDI + 8 + (ulong)((in_ESI != 0 ^ 0xffU) & 1) * 8) == size) {
      *(size_t *)(size + 0x10) = size + (long)in_RDX;
      *(size_t *)(size + 0x18) = size + (long)in_RDX;
    }
  }
  else {
    if (*(size_t *)(lVar1 + (ulong)in_ESI * 8) != size) {
      DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
    }
    ZoneAllocator::release((ZoneAllocator *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,size);
    *(undefined8 *)(lVar1 + (ulong)in_ESI * 8) = 0;
    *(long *)(in_RDI + 8 + (ulong)in_ESI * 8) = lVar1;
  }
  return;
}

Assistant:

void ZoneStackBase::_cleanupBlock(uint32_t side, size_t middleIndex) noexcept {
  Block* block = _block[side];
  ASMJIT_ASSERT(block->empty());

  Block* prev = block->_link[!side];
  if (prev) {
    ASMJIT_ASSERT(prev->_link[side] == block);
    _allocator->release(block, kBlockSize);

    prev->_link[side] = nullptr;
    _block[side] = prev;
  }
  else if (_block[!side] == block) {
    // If the container becomes empty center both pointers in the remaining block.
    block->_start = (uint8_t*)block + middleIndex;
    block->_end = (uint8_t*)block + middleIndex;
  }
}